

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O3

void decompTest(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int w,int h,int pf,
               char *basename,int subsamp,int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  tjscalingfactor sf;
  uint width;
  int iVar5;
  uint height;
  int iVar6;
  tjscalingfactor *ptVar7;
  byte *dstBuf;
  unsigned_long __size;
  tjhandle handle_00;
  uchar *puVar8;
  uint uVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  byte *local_f0;
  int local_a4;
  int _hdrh;
  int _hdrw;
  uchar *local_98;
  ulong local_90;
  ulong local_88;
  tjhandle local_80;
  unsigned_long local_78;
  int n;
  char *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  tjscalingfactor *local_40;
  long local_38;
  
  n = 0;
  local_80 = handle;
  local_78 = jpegSize;
  ptVar7 = tjGetScalingFactors(&n);
  if (n == 0 || ptVar7 == (tjscalingfactor *)0x0) {
    pcVar17 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",pcVar17);
    exitStatus = -1;
  }
  else if (0 < n) {
    lVar12 = (long)pf;
    local_68 = "Bottom-Up";
    if ((subsamp & 2U) == 0) {
      local_68 = "Top-Down ";
    }
    local_60 = lVar12 - 7;
    local_38 = 0;
    iVar5 = n;
    local_40 = ptVar7;
LAB_0010883a:
    if (((int)basename == 0) || ((int)basename == 3)) {
LAB_0010888a:
      sf = ptVar7[local_38];
      _hdrw = 0;
      _hdrh = 0;
      local_a4 = -1;
      iVar23 = sf.num;
      iVar15 = sf.denom;
      width = (iVar23 * w + iVar15 + -1) / iVar15;
      uVar14 = (long)(iVar23 * h + iVar15 + -1) / (long)iVar15;
      iVar5 = tjDecompressHeader2(local_80,jpegBuf,local_78,&_hdrw,&_hdrh,&local_a4);
      if (iVar5 != -1) {
        if (((_hdrw != w) || (_hdrh != h)) || (local_a4 != (int)basename)) {
          pcVar16 = "ERROR: %s\n";
          pcVar17 = "Incorrect JPEG header";
          goto LAB_00108a39;
        }
        height = (uint)uVar14;
        lVar10 = (long)tjPixelSize[lVar12];
        dstBuf = (byte *)calloc(1,(int)(height * width) * lVar10);
        if (dstBuf == (byte *)0x0) {
          pcVar16 = "ERROR: %s\n";
          pcVar17 = "Memory allocation failure";
          goto LAB_00108a39;
        }
        if (doYUV != 0) {
          __size = tjBufSizeYUV2(width,pad,height,(int)basename);
          handle_00 = tjInitDecompress();
          if (handle_00 == (tjhandle)0x0) {
            pcVar17 = tjGetErrorStr();
            pcVar16 = "TurboJPEG ERROR:\n%s\n";
LAB_00108b52:
            printf(pcVar16,pcVar17);
            goto LAB_00108b8e;
          }
          puVar8 = (uchar *)calloc(1,__size);
          if (puVar8 == (uchar *)0x0) {
            pcVar16 = "ERROR: %s\n";
            pcVar17 = "Memory allocation failure";
            goto LAB_00108b52;
          }
          local_98 = puVar8;
          printf("JPEG -> YUV %s ",subNameLong[(ulong)basename & 0xffffffff]);
          if (iVar23 == 1 && iVar15 == 1) {
            printf("... ");
          }
          else {
            printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
          }
          puVar8 = local_98;
          iVar5 = tjDecompressToYUV2(local_80,jpegBuf,local_78,local_98,width,pad,height,subsamp);
          if (iVar5 == -1) {
            pcVar17 = tjGetErrorStr();
            printf("TurboJPEG ERROR:\n%s\n",pcVar17);
            exitStatus = -1;
          }
          else {
            iVar5 = checkBufYUV(puVar8,width,height,(int)basename,sf);
            pcVar17 = "Passed.";
            if (iVar5 == 0) {
              pcVar17 = "FAILED!";
            }
            puts(pcVar17);
            printf("YUV %s -> %s %s ... ",subNameLong[(ulong)basename & 0xffffffff],
                   pixFormatStr[lVar12],local_68);
            iVar5 = tjDecodeYUV(handle_00,puVar8,pad,(int)basename,dstBuf,width,0,height,pf,subsamp)
            ;
            if (iVar5 != -1) {
              tjDestroy(handle_00);
              goto LAB_00108cb0;
            }
            pcVar17 = tjGetErrorStr();
            printf("TurboJPEG ERROR:\n%s\n",pcVar17);
            exitStatus = -1;
            puVar8 = local_98;
          }
          goto LAB_00108a4f;
        }
        printf("JPEG -> %s %s ",pixFormatStr[lVar12],local_68);
        if (iVar23 == 1 && iVar15 == 1) {
          printf("... ");
        }
        else {
          printf("%d/%d ... ",(ulong)sf & 0xffffffff,(ulong)sf >> 0x20);
        }
        iVar5 = tjDecompress2(local_80,jpegBuf,local_78,dstBuf,width,0,height,pf,subsamp);
        if (iVar5 == -1) {
          pcVar17 = tjGetErrorStr();
          printf("TurboJPEG ERROR:\n%s\n",pcVar17);
LAB_00108b8e:
          exitStatus = -1;
          puVar8 = (uchar *)0x0;
          goto LAB_00108a4f;
        }
        local_98 = (uchar *)0x0;
LAB_00108cb0:
        iVar6 = (iVar23 << 4) / iVar15;
        iVar15 = (iVar23 * 8) / iVar15;
        iVar5 = 0;
        iVar23 = 0;
        iVar21 = 0;
        if (pf != 6) {
          iVar5 = tjBlueOffset[lVar12];
          iVar23 = tjGreenOffset[lVar12];
          iVar21 = tjRedOffset[lVar12];
        }
        pcVar17 = "Passed.";
        if (pf == 0xb) {
          if (0 < (int)height) {
            uVar22 = 0;
LAB_00108d4b:
            if ((int)width < 1) goto LAB_00108e36;
            uVar9 = ~uVar22 + height;
            if ((subsamp & 2U) == 0) {
              uVar9 = uVar22;
            }
            pbVar11 = dstBuf + (int)(uVar9 * width) * lVar10 + 3;
            uVar13 = 0;
LAB_00108d85:
            bVar1 = pbVar11[-3];
            bVar2 = pbVar11[-2];
            uVar19 = (ulong)bVar2;
            bVar3 = pbVar11[-1];
            bVar4 = *pbVar11;
            uVar18 = (ulong)bVar4;
            if (((int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                      (long)iVar15) + (int)uVar22 / iVar15 & 1U) == 0) {
              if (bVar1 < 0xfe) goto LAB_001090cb;
              if (bVar2 < 0xfe) {
                pcVar16 = "\nComp. %s at %d,%d should be 255, not %d\n";
                pcVar17 = "m";
                uVar18 = uVar19;
                goto LAB_00109158;
              }
              if (bVar3 < 0xfe) {
                pcVar16 = "\nComp. %s at %d,%d should be 255, not %d\n";
                goto LAB_00109132;
              }
              if ((int)uVar22 < iVar6) {
                if (bVar4 < 0xfe) {
                  pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_001091e9:
                  pcVar16 = "k";
                  uVar19 = uVar18;
                  goto LAB_0010920f;
                }
              }
              else if (1 < bVar4) {
                pcVar17 = "\nComp. %s at %d,%d should be 0, not %d\n";
                goto LAB_001091e9;
              }
LAB_00108e25:
              uVar13 = uVar13 + 1;
              pbVar11 = pbVar11 + lVar10;
              if (width == uVar13) goto LAB_00108e36;
              goto LAB_00108d85;
            }
            if (bVar1 < 0xfe) {
LAB_001090cb:
              pcVar16 = "\nComp. %s at %d,%d should be 255, not %d\n";
              pcVar17 = "c";
              uVar18 = (ulong)bVar1;
            }
            else if (bVar3 < 2) {
              if (0xfd < bVar4) {
                if (iVar6 <= (int)uVar22) {
                  if (0xfd < bVar2) goto LAB_00108e25;
                  pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_001091ff:
                  pcVar16 = "m";
LAB_0010920f:
                  printf(pcVar17,pcVar16,(ulong)uVar22,uVar13 & 0xffffffff,uVar19);
                  goto LAB_0010921b;
                }
                if (1 < bVar2) {
                  pcVar17 = "\nComp. %s at %d,%d should be 0, not %d\n";
                  goto LAB_001091ff;
                }
                goto LAB_00108e25;
              }
              pcVar16 = "\nComp. %s at %d,%d should be 255, not %d\n";
              pcVar17 = "k";
            }
            else {
              pcVar16 = "\nComp. %s at %d,%d should be 0, not %d\n";
LAB_00109132:
              pcVar17 = "y";
              uVar18 = (ulong)bVar3;
            }
LAB_00109158:
            printf(pcVar16,pcVar17,(ulong)uVar22,uVar13 & 0xffffffff,uVar18);
LAB_0010921b:
            exitStatus = -1;
            pcVar17 = "FAILED!";
            if (0 < (int)height) {
              local_90 = (ulong)width;
              uVar13 = 0;
              local_f0 = dstBuf;
              local_88 = uVar14 & 0xffffffff;
              do {
                uVar14 = local_90;
                pbVar11 = local_f0;
                if (0 < (int)width) {
                  do {
                    if (pf == 0xb) {
                      printf("%.3d/%.3d/%.3d/%.3d ",(ulong)*pbVar11,(ulong)pbVar11[1],
                             (ulong)pbVar11[2],(ulong)pbVar11[3]);
                    }
                    else {
                      printf("%.3d/%.3d/%.3d ",(ulong)pbVar11[iVar21],(ulong)pbVar11[iVar23],
                             (ulong)pbVar11[iVar5]);
                    }
                    uVar14 = uVar14 - 1;
                    pbVar11 = pbVar11 + lVar10;
                  } while (uVar14 != 0);
                }
                putchar(10);
                uVar13 = uVar13 + 1;
                local_f0 = local_f0 + (int)width * lVar10;
              } while (uVar13 != local_88);
              pcVar17 = "FAILED!";
            }
          }
        }
        else if (0 < (int)height) {
          local_58 = (long)tjAlphaOffset[lVar12];
          local_88 = (ulong)iVar21;
          local_90 = (ulong)iVar23;
          local_48 = (long)iVar5;
          local_50 = (ulong)width;
          uVar22 = 0;
          do {
            if (0 < (int)width) {
              uVar9 = ~uVar22 + height;
              if ((subsamp & 2U) == 0) {
                uVar9 = uVar22;
              }
              pbVar11 = dstBuf + (int)(uVar9 * width) * lVar10;
              uVar13 = 0;
              do {
                bVar1 = pbVar11[local_88];
                uVar19 = (ulong)bVar1;
                bVar2 = pbVar11[local_90];
                bVar3 = pbVar11[local_48];
                uVar18 = 0xff;
                if (local_60 < 4) {
                  uVar18 = (ulong)pbVar11[local_58];
                }
                if (((int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff)
                          / (long)iVar15) + (int)uVar22 / iVar15 & 1U) != 0) {
                  if ((int)basename == 3) {
                    if ((int)uVar22 < iVar6) {
                      if ((byte)(bVar1 + 0xb2) < 0xfd) {
                        uVar20 = 0x4c;
LAB_00109384:
                        pcVar17 = "r";
                      }
                      else {
                        if ((byte)(bVar2 + 0xb2) < 0xfd) {
                          uVar20 = 0x4c;
                          goto LAB_001093bf;
                        }
                        if (0xfc < (byte)(bVar3 + 0xb2)) goto LAB_0010900e;
                        uVar20 = 0x4c;
LAB_001093fa:
                        pcVar17 = "b";
                        uVar19 = (ulong)bVar3;
                      }
                    }
                    else {
                      if ((byte)(bVar1 + 0x1c) < 0xfd) {
                        uVar20 = 0xe2;
                        goto LAB_00109384;
                      }
                      if (0xfc < (byte)(bVar2 + 0x1c)) {
                        if ((byte)(bVar3 + 0x1c) < 0xfd) {
                          uVar20 = 0xe2;
                          goto LAB_001093fa;
                        }
                        goto LAB_0010900e;
                      }
                      uVar20 = 0xe2;
LAB_001093bf:
                      pcVar17 = "g";
                      uVar19 = (ulong)bVar2;
                    }
                    printf("\nComp. %s at %d,%d should be %d, not %d\n",pcVar17,(ulong)uVar22,
                           uVar13 & 0xffffffff,uVar20,uVar19);
                  }
                  else {
                    if ((int)uVar22 < iVar6) {
                      if (0xfd < bVar1) goto LAB_00108fc0;
                    }
                    else if (0xfd < bVar1) {
                      if (bVar2 < 0xfe) goto LAB_0010917a;
                      goto LAB_00109004;
                    }
LAB_001090fd:
                    pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_0010919a:
                    pcVar16 = "r";
LAB_001091c3:
                    printf(pcVar17,pcVar16,(ulong)uVar22,uVar13 & 0xffffffff,uVar19);
                  }
                  goto LAB_0010921b;
                }
                if ((int)uVar22 < iVar6) {
                  if (bVar1 < 0xfe) goto LAB_001090fd;
                  if (bVar2 < 0xfe) {
LAB_0010917a:
                    pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
                    goto LAB_00109181;
                  }
                  if (0xfd < bVar3) goto LAB_0010900e;
                  pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
LAB_001091b3:
                  pcVar16 = "b";
                  uVar19 = (ulong)bVar3;
                  goto LAB_001091c3;
                }
                if (1 < bVar1) {
                  pcVar17 = "\nComp. %s at %d,%d should be 0, not %d\n";
                  goto LAB_0010919a;
                }
LAB_00108fc0:
                if (1 < bVar2) {
                  pcVar17 = "\nComp. %s at %d,%d should be 0, not %d\n";
LAB_00109181:
                  pcVar16 = "g";
                  uVar19 = (ulong)bVar2;
                  goto LAB_001091c3;
                }
LAB_00109004:
                if (1 < bVar3) {
                  pcVar17 = "\nComp. %s at %d,%d should be 0, not %d\n";
                  goto LAB_001091b3;
                }
LAB_0010900e:
                if ((uint)uVar18 < 0xfe) {
                  pcVar17 = "\nComp. %s at %d,%d should be 255, not %d\n";
                  pcVar16 = "a";
                  uVar19 = uVar18;
                  goto LAB_001091c3;
                }
                uVar13 = uVar13 + 1;
                pbVar11 = pbVar11 + lVar10;
              } while (local_50 != uVar13);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != height);
          pcVar17 = "Passed.";
        }
        goto LAB_00109333;
      }
      pcVar17 = tjGetErrorStr();
      pcVar16 = "TurboJPEG ERROR:\n%s\n";
LAB_00108a39:
      printf(pcVar16,pcVar17);
      exitStatus = -1;
      dstBuf = (byte *)0x0;
      puVar8 = (uchar *)0x0;
      goto LAB_00108a4f;
    }
    if ((int)basename == 5) {
      if ((ptVar7[local_38].num == 1) && (ptVar7[local_38].denom - 1U < 2)) goto LAB_0010888a;
    }
    else if (((ptVar7[local_38].num == 1) && ((uint)ptVar7[local_38].denom < 5)) &&
            ((0x16U >> (ptVar7[local_38].denom & 0x1fU) & 1) != 0)) goto LAB_0010888a;
    goto LAB_00108a73;
  }
  return;
LAB_00108e36:
  uVar22 = uVar22 + 1;
  if (uVar22 == height) goto code_r0x00108e48;
  goto LAB_00108d4b;
code_r0x00108e48:
  pcVar17 = "Passed.";
LAB_00109333:
  printf(pcVar17);
  putchar(10);
  puVar8 = local_98;
LAB_00108a4f:
  free(puVar8);
  free(dstBuf);
  ptVar7 = local_40;
  iVar5 = n;
LAB_00108a73:
  local_38 = local_38 + 1;
  if (iVar5 <= local_38) {
    return;
  }
  goto LAB_0010883a;
}

Assistant:

static void decompTest(tjhandle handle, unsigned char *jpegBuf,
                       unsigned long jpegSize, int w, int h, int pf,
                       char *basename, int subsamp, int flags)
{
  int i, n = 0;
  tjscalingfactor *sf = tjGetScalingFactors(&n);

  if (!sf || !n) THROW_TJ();

  for (i = 0; i < n; i++) {
    if (subsamp == TJSAMP_444 || subsamp == TJSAMP_GRAY ||
        (subsamp == TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 2 || sf[i].denom == 1)) ||
        (subsamp != TJSAMP_411 && sf[i].num == 1 &&
         (sf[i].denom == 4 || sf[i].denom == 2 || sf[i].denom == 1)))
      _decompTest(handle, jpegBuf, jpegSize, w, h, pf, basename, subsamp,
                  flags, sf[i]);
  }

bailout:
  return;
}